

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_classes.cc
# Opt level: O0

bool __thiscall
TolerancePicker::operator()
          (TolerancePicker *this,
          sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_> *sample
          ,cvector *actual)

{
  ostream *poVar1;
  complex *pcVar2;
  double dVar3;
  double err;
  cvector *actual_local;
  sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_> *sample_local;
  TolerancePicker *this_local;
  
  dVar3 = PhaseSubtractor::phase_difference((PhaseSubtractor *)this,sample,actual);
  poVar1 = std::operator<<((ostream *)&std::cerr,"Output=");
  pcVar2 = (complex *)
           std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                     (actual,0);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1," PhaseError=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 0.05 < dVar3;
}

Assistant:

bool operator()(const learning::sample<cvector> &sample, const cvector &actual) const {
		double err = phase_difference(sample, actual);

		cerr << "Output=" << actual[0] << " PhaseError=" << err << endl;

		return err > TOLERANCE;
	}